

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O3

QRgbaFloat32 *
fetchTransformedFP<(TextureBlendType)3>
          (QRgbaFloat32 *buffer,Operator *param_2,QSpanData *data,int y,int x,int length)

{
  uchar *puVar1;
  undefined8 *puVar2;
  uchar *puVar3;
  undefined4 *puVar4;
  float fVar5;
  BPP BVar6;
  uint uVar7;
  double dVar8;
  double dVar9;
  undefined1 auVar10 [16];
  ulong uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  long lVar21;
  long lVar22;
  QRgbaFloat32 *pQVar23;
  long in_FS_OFFSET;
  int iVar24;
  int iVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  uint buffer32 [2048];
  double local_40a8;
  double dStack_40a0;
  double dStack_4070;
  unsigned_long_long local_4038 [2049];
  long local_30;
  
  uVar11 = (ulong)(uint)length;
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  BVar6 = qPixelLayouts[(data->field_23).texture.format].bpp;
  if ((int)BVar6 < 7) {
    if (BVar6 == BPP32) {
      fetchTransformed_fetcher<(TextureBlendType)3,(QPixelLayout::BPP)6,unsigned_int>
                ((uint *)local_4038,data,y,x,length);
    }
    else {
      fetchTransformed_fetcher<(TextureBlendType)3,(QPixelLayout::BPP)0,unsigned_int>
                ((uint *)local_4038,data,y,x,length);
    }
    (*qConvertToRGBA32F[(data->field_23).texture.format])
              (buffer,(uint *)local_4038,length,(data->field_23).texture.colorTable,
               (QDitherInfo *)0x0);
    goto LAB_00668b72;
  }
  if (BVar6 < BPP32FPx4) {
    fetchTransformed_fetcher<(TextureBlendType)3,(QPixelLayout::BPP)7,unsigned_long_long>
              (local_4038,data,y,x,length);
    (*convert64ToRGBA32F[(data->field_23).texture.format])(buffer,local_4038,length);
    goto LAB_00668b72;
  }
  dVar28 = (double)x + 0.5;
  dVar29 = (double)y + 0.5;
  if ((data->field_0x8a & 1) == 0) {
    local_40a8 = data->m11;
    dStack_40a0 = data->m12;
LAB_00668cc5:
    if (length < 1) goto LAB_00668b72;
    dVar27 = data->m13;
    dVar31 = data->m23 * dVar29 + dVar28 * dVar27 + data->m33;
    dVar30 = data->dx + data->m21 * dVar29 + dVar28 * local_40a8;
    dStack_4070 = data->dy + data->m22 * dVar29 + dVar28 * dStack_40a0;
    pQVar23 = buffer;
    do {
      dVar29 = (double)(-(ulong)(dVar31 == 0.0) & 0x3ff0000000000000 |
                       ~-(ulong)(dVar31 == 0.0) & (ulong)(1.0 / dVar31));
      auVar10._8_4_ = SUB84(dStack_4070,0);
      auVar10._0_8_ = dVar30;
      auVar10._12_4_ = (int)((ulong)dStack_4070 >> 0x20);
      dVar28 = floor(dVar30 * dVar29);
      dVar29 = floor(dStack_4070 * dVar29);
      iVar19 = (int)dVar29;
      uVar7 = (data->field_23).texture.height;
      if (iVar19 < 0 || (int)uVar7 <= iVar19) {
        iVar19 = (iVar19 % (int)uVar7 >> 0x1f & uVar7) + iVar19 % (int)uVar7;
      }
      iVar17 = (int)dVar28;
      uVar7 = (data->field_23).texture.width;
      dStack_4070 = auVar10._8_8_;
      if (iVar17 < 0 || (int)uVar7 <= iVar17) {
        iVar17 = (iVar17 % (int)uVar7 >> 0x1f & uVar7) + iVar17 % (int)uVar7;
      }
      puVar1 = (data->field_23).texture.imageData +
               (long)iVar17 * 0x10 + (long)iVar19 * (data->field_23).texture.bytesPerLine;
      uVar15 = *(undefined8 *)puVar1;
      uVar16 = *(undefined8 *)(puVar1 + 8);
      pQVar23->r = (float)(int)uVar15;
      pQVar23->g = (float)(int)((ulong)uVar15 >> 0x20);
      pQVar23->b = (float)(int)uVar16;
      pQVar23->a = (float)(int)((ulong)uVar16 >> 0x20);
      dVar30 = dVar30 + local_40a8;
      dStack_4070 = dStack_4070 + dStack_40a0;
      dVar31 = dVar31 + dVar27;
      dVar31 = (double)((ulong)dVar31 & -(ulong)(dVar31 != 0.0) |
                       ~-(ulong)(dVar31 != 0.0) & (ulong)(dVar27 + dVar31));
      pQVar23 = pQVar23 + 1;
    } while (pQVar23 < buffer + length);
  }
  else {
    local_40a8 = data->m11;
    dStack_40a0 = data->m12;
    dVar30 = (dVar29 * data->m21 + dVar28 * local_40a8 + data->dx) * 65536.0;
    dVar31 = (dVar29 * data->m22 + dVar28 * dStack_40a0 + data->dy) * 65536.0;
    dVar27 = dVar31;
    if (dVar30 <= dVar31) {
      dVar27 = dVar30;
    }
    dVar8 = trunc(local_40a8 * 65536.0);
    dVar9 = trunc(dStack_40a0 * 65536.0);
    dVar8 = (double)length * dVar8 + dVar30;
    dVar9 = (double)length * dVar9 + dVar31;
    dVar26 = dVar9;
    if (dVar8 <= dVar9) {
      dVar26 = dVar8;
    }
    if (dVar27 <= dVar26) {
      dVar26 = dVar27;
    }
    if (dVar26 < -2147483648.0) goto LAB_00668cc5;
    dVar27 = dVar31;
    if (dVar31 <= dVar30) {
      dVar27 = dVar30;
    }
    if (dVar9 <= dVar8) {
      dVar9 = dVar8;
    }
    if (dVar9 <= dVar27) {
      dVar9 = dVar27;
    }
    if (2147483647.0 < dVar9) goto LAB_00668cc5;
    iVar24 = (int)(local_40a8 * 65536.0);
    iVar25 = (int)(dStack_40a0 * 65536.0);
    iVar17 = (int)dVar30;
    iVar19 = (int)dVar31;
    if (iVar25 == 0) {
      iVar19 = iVar19 >> 0x10;
      uVar7 = (data->field_23).texture.height;
      if (iVar19 < 0 || (int)uVar7 <= iVar19) {
        iVar19 = (iVar19 % (int)uVar7 >> 0x1f & uVar7) + iVar19 % (int)uVar7;
      }
      if (length < 1) goto LAB_00668b72;
      lVar21 = (data->field_23).texture.bytesPerLine;
      puVar1 = (data->field_23).texture.imageData;
      lVar22 = 0;
      do {
        iVar25 = iVar17 >> 0x10;
        uVar7 = (data->field_23).texture.width;
        if (iVar25 < 0 || (int)uVar7 <= iVar25) {
          iVar25 = (iVar25 % (int)uVar7 >> 0x1f & uVar7) + iVar25 % (int)uVar7;
        }
        puVar3 = puVar1 + (long)iVar25 * 0x10 + iVar19 * lVar21;
        uVar12 = *(undefined4 *)(puVar3 + 4);
        uVar13 = *(undefined4 *)(puVar3 + 8);
        uVar14 = *(undefined4 *)(puVar3 + 0xc);
        puVar4 = (undefined4 *)((long)&buffer->r + lVar22);
        *puVar4 = *(undefined4 *)puVar3;
        puVar4[1] = uVar12;
        puVar4[2] = uVar13;
        puVar4[3] = uVar14;
        iVar17 = iVar17 + iVar24;
        lVar22 = lVar22 + 0x10;
      } while (uVar11 * 0x10 != lVar22);
    }
    else {
      if (length < 1) goto LAB_00668b72;
      lVar21 = 0;
      do {
        iVar20 = iVar17 >> 0x10;
        uVar7 = (data->field_23).texture.width;
        if (iVar20 < 0 || (int)uVar7 <= iVar20) {
          iVar20 = (iVar20 % (int)uVar7 >> 0x1f & uVar7) + iVar20 % (int)uVar7;
        }
        iVar18 = iVar19 >> 0x10;
        uVar7 = (data->field_23).texture.height;
        if (iVar18 < 0 || (int)uVar7 <= iVar18) {
          iVar18 = (iVar18 % (int)uVar7 >> 0x1f & uVar7) + iVar18 % (int)uVar7;
        }
        puVar1 = (data->field_23).texture.imageData +
                 (long)iVar20 * 0x10 + (long)iVar18 * (data->field_23).texture.bytesPerLine;
        uVar15 = *(undefined8 *)(puVar1 + 8);
        puVar2 = (undefined8 *)((long)&buffer->r + lVar21);
        *puVar2 = *(undefined8 *)puVar1;
        puVar2[1] = uVar15;
        iVar17 = iVar17 + iVar24;
        iVar19 = iVar19 + iVar25;
        lVar21 = lVar21 + 0x10;
      } while (uVar11 * 0x10 != lVar21);
    }
  }
  if ((0 < length) && ((data->field_23).texture.format == Format_RGBA32FPx4)) {
    lVar21 = 0;
    do {
      fVar5 = *(float *)((long)&buffer->a + lVar21);
      *(ulong *)((long)&buffer->r + lVar21) =
           CONCAT44(*(float *)((long)&buffer->g + lVar21) * fVar5,
                    fVar5 * *(float *)((long)&buffer->r + lVar21));
      *(ulong *)((long)&buffer->b + lVar21) =
           CONCAT44(fVar5,*(float *)((long)&buffer->b + lVar21) * fVar5);
      lVar21 = lVar21 + 0x10;
    } while (uVar11 << 4 != lVar21);
  }
LAB_00668b72:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return buffer;
}

Assistant:

static const QRgbaFloat32 *QT_FASTCALL fetchTransformedFP(QRgbaFloat32 *buffer, const Operator *, const QSpanData *data,
                                                      int y, int x, int length)
{
    const QPixelLayout *layout = &qPixelLayouts[data->texture.format];
    if (layout->bpp < QPixelLayout::BPP64) {
        Q_DECL_UNINITIALIZED uint buffer32[BufferSize];
        Q_ASSERT(length <= BufferSize);
        if (layout->bpp == QPixelLayout::BPP32)
            fetchTransformed_fetcher<blendType, QPixelLayout::BPP32, uint>(buffer32, data, y, x, length);
        else
            fetchTransformed_fetcher<blendType, QPixelLayout::BPPNone, uint>(buffer32, data, y, x, length);
        qConvertToRGBA32F[data->texture.format](buffer, buffer32, length, data->texture.colorTable, nullptr);
    } else if (layout->bpp < QPixelLayout::BPP32FPx4) {
        Q_DECL_UNINITIALIZED quint64 buffer64[BufferSize];
        fetchTransformed_fetcher<blendType, QPixelLayout::BPP64, quint64>(buffer64, data, y, x, length);
        convert64ToRGBA32F[data->texture.format](buffer, buffer64, length);
    } else {
        fetchTransformed_fetcher<blendType, QPixelLayout::BPP32FPx4, QRgbaFloat32>(buffer, data, y, x, length);
        if (data->texture.format == QImage::Format_RGBA32FPx4)
            convertRGBA32FToRGBA32FPM(buffer, length);
        return buffer;
    }
    return buffer;
}